

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

Atlas * xatlas::Create(void)

{
  Context *this;
  TaskScheduler *this_00;
  Context *ctx;
  
  this = (Context *)
         internal::Realloc((void *)0x0,0x110,0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                           ,0x22c3);
  memset(this,0,0x110);
  Context::Context(this);
  memset(this,0,0x30);
  this_00 = (TaskScheduler *)
            internal::Realloc((void *)0x0,0x28,0,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                              ,0x22c5);
  internal::TaskScheduler::TaskScheduler(this_00);
  this->taskScheduler = this_00;
  return &this->atlas;
}

Assistant:

Atlas *Create()
{
	Context *ctx = XA_NEW(internal::MemTag::Default, Context);
	memset(&ctx->atlas, 0, sizeof(Atlas));
	ctx->taskScheduler = XA_NEW(internal::MemTag::Default, internal::TaskScheduler);
	return &ctx->atlas;
}